

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

void __thiscall
soplex::SPxScaler<double>::applyScaling(SPxScaler<double> *this,SPxLPBase<double> *lp)

{
  double dVar1;
  uint uVar2;
  DataArray<int> *pDVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  double *pdVar7;
  int __c;
  int __c_00;
  SPxLPBase<double> *in_RSI;
  SPxScaler<double> *in_RDI;
  Real RVar8;
  int j_1;
  int exp2_1;
  int exp1_1;
  SVectorBase<double> *vec_1;
  int i_1;
  int j;
  int exp2;
  int exp1;
  SVectorBase<double> *vec;
  int i;
  DataArray<int> *rowscaleExp;
  DataArray<int> *colscaleExp;
  int in_stack_ffffffffffffff1c;
  SPxLPBase<double> *in_stack_ffffffffffffff20;
  uint local_54;
  int local_50;
  int local_4c;
  SVectorBase<double> *local_48;
  int local_40;
  uint local_3c;
  int local_38;
  int local_34;
  SVectorBase<double> *local_30;
  int local_24;
  DataArray<int> *local_20;
  DataArray<int> *local_18;
  SPxLPBase<double> *local_10;
  
  local_18 = &(in_RSI->super_LPColSetBase<double>).scaleExp;
  local_20 = &(in_RSI->super_LPRowSetBase<double>).scaleExp;
  local_24 = 0;
  local_10 = in_RSI;
  while( true ) {
    iVar5 = local_24;
    iVar4 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2d13ff);
    if (iVar4 <= iVar5) break;
    local_30 = SPxLPBase<double>::rowVector_w(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    piVar6 = DataArray<int>::operator[](local_20,local_24);
    local_38 = *piVar6;
    local_3c = 0;
    while( true ) {
      uVar2 = local_3c;
      iVar5 = SVectorBase<double>::size(local_30);
      pDVar3 = local_18;
      if (iVar5 <= (int)uVar2) break;
      piVar6 = (int *)SVectorBase<double>::index(local_30,(char *)(ulong)local_3c,__c);
      piVar6 = DataArray<int>::operator[](pDVar3,*piVar6);
      local_34 = *piVar6;
      SVectorBase<double>::value(local_30,local_3c);
      RVar8 = spxLdexp((Real)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      pdVar7 = SVectorBase<double>::value(local_30,local_3c);
      *pdVar7 = RVar8;
      local_3c = local_3c + 1;
    }
    SPxLPBase<double>::maxRowObj(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    RVar8 = spxLdexp((Real)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    pdVar7 = SPxLPBase<double>::maxRowObj_w(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    *pdVar7 = RVar8;
    pdVar7 = SPxLPBase<double>::rhs(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    dVar1 = *pdVar7;
    pdVar7 = (double *)infinity();
    if (dVar1 < *pdVar7) {
      SPxLPBase<double>::rhs_w(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      RVar8 = spxLdexp((Real)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      pdVar7 = SPxLPBase<double>::rhs_w(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      *pdVar7 = RVar8;
    }
    pdVar7 = SPxLPBase<double>::lhs(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    dVar1 = *pdVar7;
    pdVar7 = (double *)infinity();
    if (-*pdVar7 < dVar1) {
      SPxLPBase<double>::lhs_w(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      RVar8 = spxLdexp((Real)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      pdVar7 = SPxLPBase<double>::lhs_w(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      *pdVar7 = RVar8;
    }
    SPxOut::debug<soplex::SPxScaler<double>,_const_char_(&)[28],_int_&,_int_&,_0>
              (in_RDI,(char (*) [28])"DEBUG: rowscaleExp({}): {}\n",&local_24,&local_38);
    local_24 = local_24 + 1;
  }
  local_40 = 0;
  while( true ) {
    iVar5 = local_40;
    iVar4 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2d16cd);
    if (iVar4 <= iVar5) break;
    local_48 = SPxLPBase<double>::colVector_w(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    piVar6 = DataArray<int>::operator[](local_18,local_40);
    local_50 = *piVar6;
    local_54 = 0;
    while( true ) {
      iVar5 = SVectorBase<double>::size(local_48);
      pDVar3 = local_20;
      if (iVar5 <= (int)local_54) break;
      piVar6 = (int *)SVectorBase<double>::index(local_48,(char *)(ulong)local_54,__c_00);
      piVar6 = DataArray<int>::operator[](pDVar3,*piVar6);
      local_4c = *piVar6;
      SVectorBase<double>::value(local_48,local_54);
      RVar8 = spxLdexp((Real)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      pdVar7 = SVectorBase<double>::value(local_48,local_54);
      *pdVar7 = RVar8;
      local_54 = local_54 + 1;
    }
    SPxLPBase<double>::maxObj_w(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    RVar8 = spxLdexp((Real)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    pdVar7 = SPxLPBase<double>::maxObj_w(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    *pdVar7 = RVar8;
    pdVar7 = SPxLPBase<double>::upper(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    dVar1 = *pdVar7;
    pdVar7 = (double *)infinity();
    if (dVar1 < *pdVar7) {
      SPxLPBase<double>::upper_w(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      RVar8 = spxLdexp((Real)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      pdVar7 = SPxLPBase<double>::upper_w(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      *pdVar7 = RVar8;
    }
    pdVar7 = SPxLPBase<double>::lower(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    dVar1 = *pdVar7;
    pdVar7 = (double *)infinity();
    if (-*pdVar7 < dVar1) {
      SPxLPBase<double>::lower_w(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      in_stack_ffffffffffffff20 =
           (SPxLPBase<double> *)spxLdexp((Real)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      pdVar7 = SPxLPBase<double>::lower_w(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      *pdVar7 = (double)in_stack_ffffffffffffff20;
    }
    SPxOut::debug<soplex::SPxScaler<double>,_const_char_(&)[28],_int_&,_int_&,_0>
              (in_RDI,(char (*) [28])"DEBUG: colscaleExp({}): {}\n",&local_40,&local_50);
    local_40 = local_40 + 1;
  }
  SPxLPBase<double>::setScalingInfo(local_10,true);
  return;
}

Assistant:

void SPxScaler<R>::applyScaling(SPxLPBase<R>& lp)
{
   assert(lp.nCols() == m_activeColscaleExp->size());
   assert(lp.nRows() == m_activeRowscaleExp->size());

   DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      SVectorBase<R>& vec = lp.rowVector_w(i);
      int exp1;
      int exp2 = rowscaleExp[i];

      for(int j = 0; j < vec.size(); ++j)
      {
         exp1 = colscaleExp[vec.index(j)];
         vec.value(j) = spxLdexp(vec.value(j), exp1 + exp2);
      }

      lp.maxRowObj_w(i) = spxLdexp(lp.maxRowObj(i), exp2);

      if(lp.rhs(i) < R(infinity))
         lp.rhs_w(i) = spxLdexp(lp.rhs_w(i), exp2);

      if(lp.lhs(i) > R(-infinity))
         lp.lhs_w(i) = spxLdexp(lp.lhs_w(i), exp2);

      SPxOut::debug(this, "DEBUG: rowscaleExp({}): {}\n", i, exp2);
   }

   for(int i = 0; i < lp.nCols(); ++i)
   {
      SVectorBase<R>& vec = lp.colVector_w(i);
      int exp1;
      int exp2 = colscaleExp[i];

      for(int j = 0; j < vec.size(); ++j)
      {
         exp1 = rowscaleExp[vec.index(j)];
         vec.value(j) = spxLdexp(vec.value(j), exp1 + exp2);
      }

      lp.maxObj_w(i) = spxLdexp(lp.maxObj_w(i), exp2);

      if(lp.upper(i) < R(infinity))
         lp.upper_w(i) = spxLdexp(lp.upper_w(i), -exp2);

      if(lp.lower(i) > R(-infinity))
         lp.lower_w(i) = spxLdexp(lp.lower_w(i), -exp2);

      SPxOut::debug(this, "DEBUG: colscaleExp({}): {}\n", i, exp2);
   }

   lp.setScalingInfo(true);
   assert(lp.isConsistent());
}